

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

void __thiscall cmGlobalGenerator::CheckTargetLinkLibraries(cmGlobalGenerator *this)

{
  bool bVar1;
  reference this_00;
  pointer pcVar2;
  GeneratorTargetVector *pGVar3;
  reference puVar4;
  pointer pcVar5;
  unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_> *gt_1;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  GeneratorTargetVector *__range2_1;
  unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_> *gt;
  const_iterator __end2;
  const_iterator __begin2;
  GeneratorTargetVector *__range2;
  unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_> *generator;
  const_iterator __end1;
  const_iterator __begin1;
  LocalGeneratorVector *__range1;
  cmGlobalGenerator *this_local;
  
  __end1 = std::
           vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
           ::begin(&this->LocalGenerators);
  generator = (unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_> *)
              std::
              vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
              ::end(&this->LocalGenerators);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_*,_std::vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>_>
                                *)&generator);
    if (!bVar1) break;
    this_00 = __gnu_cxx::
              __normal_iterator<const_std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_*,_std::vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>_>
              ::operator*(&__end1);
    pcVar2 = std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>::operator->
                       (this_00);
    pGVar3 = cmLocalGenerator::GetGeneratorTargets(pcVar2);
    __end2 = std::
             vector<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
             ::begin(pGVar3);
    gt = (unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_> *)
         std::
         vector<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
         ::end(pGVar3);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<const_std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_*,_std::vector<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>_>
                                  *)&gt);
      if (!bVar1) break;
      puVar4 = __gnu_cxx::
               __normal_iterator<const_std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_*,_std::vector<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>_>
               ::operator*(&__end2);
      pcVar5 = std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>::
               operator->(puVar4);
      cmGeneratorTarget::CheckLinkLibraries(pcVar5);
      __gnu_cxx::
      __normal_iterator<const_std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_*,_std::vector<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>_>
      ::operator++(&__end2);
    }
    pcVar2 = std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>::operator->
                       (this_00);
    pGVar3 = cmLocalGenerator::GetOwnedImportedGeneratorTargets(pcVar2);
    __end2_1 = std::
               vector<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
               ::begin(pGVar3);
    gt_1 = (unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_> *)
           std::
           vector<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
           ::end(pGVar3);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end2_1,
                         (__normal_iterator<const_std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_*,_std::vector<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>_>
                          *)&gt_1);
      if (!bVar1) break;
      puVar4 = __gnu_cxx::
               __normal_iterator<const_std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_*,_std::vector<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>_>
               ::operator*(&__end2_1);
      pcVar5 = std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>::
               operator->(puVar4);
      cmGeneratorTarget::CheckLinkLibraries(pcVar5);
      __gnu_cxx::
      __normal_iterator<const_std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_*,_std::vector<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>_>
      ::operator++(&__end2_1);
    }
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_*,_std::vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void cmGlobalGenerator::CheckTargetLinkLibraries() const
{
  for (const auto& generator : this->LocalGenerators) {
    for (const auto& gt : generator->GetGeneratorTargets()) {
      gt->CheckLinkLibraries();
    }
    for (const auto& gt : generator->GetOwnedImportedGeneratorTargets()) {
      gt->CheckLinkLibraries();
    }
  }
}